

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelocDirWrapper.cpp
# Opt level: O0

void * __thiscall RelocBlockWrapper::getPtr(RelocBlockWrapper *this)

{
  uint uVar1;
  Executable *pEVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  offset_t oVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *local_80;
  ulong local_68;
  size_t i;
  offset_t blockSize;
  offset_t firstRaw;
  IMAGE_BASE_RELOCATION *prevReloc;
  offset_t prevRaw;
  RelocBlockWrapper *prevEntry;
  size_t prevNum;
  BYTE *ptr;
  offset_t raw;
  IMAGE_BASE_RELOCATION *reloc;
  RelocBlockWrapper *this_local;
  
  if (this->parentDir == (RelocDirWrapper *)0x0) {
    this_local = (RelocBlockWrapper *)0x0;
  }
  else {
    prevNum = (size_t)RelocDirWrapper::reloc(this->parentDir);
    if ((IMAGE_BASE_RELOCATION *)prevNum == (IMAGE_BASE_RELOCATION *)0x0) {
      this_local = (RelocBlockWrapper *)0x0;
    }
    else if (this->cachedRaw == 0xffffffffffffffff) {
      iVar4 = (*(this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.
                super_ExeNodeWrapper.super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x20])
                        (this->parentDir,(this->super_ExeNodeWrapper).entryNum - 1);
      if (CONCAT44(extraout_var_00,iVar4) == 0) {
        local_80 = (long *)0x0;
      }
      else {
        local_80 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar4),&ExeNodeWrapper::typeinfo,
                                          &typeinfo,0);
      }
      if (local_80 != (long *)0x0) {
        lVar3 = local_80[8];
        lVar5 = (**(code **)(*local_80 + 0x60))();
        oVar6 = lVar3 + (ulong)*(uint *)(lVar5 + 4);
        if (lVar3 != -1) {
          pEVar2 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
          iVar4 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                            (pEVar2,oVar6,1,8,0);
          if ((RelocBlockWrapper *)CONCAT44(extraout_var_01,iVar4) != (RelocBlockWrapper *)0x0) {
            this->cachedRaw = oVar6;
            return (RelocBlockWrapper *)CONCAT44(extraout_var_01,iVar4);
          }
        }
      }
      iVar4 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,prevNum,0);
      ptr = (BYTE *)CONCAT44(extraout_var_02,iVar4);
      uVar1 = ((IMAGE_BASE_RELOCATION *)prevNum)->SizeOfBlock;
      for (local_68 = 0; i = (size_t)uVar1, local_68 < (this->super_ExeNodeWrapper).entryNum;
          local_68 = local_68 + 1) {
        ptr = ptr + i;
        pEVar2 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        iVar4 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar2,ptr,1,8,0);
        prevNum = CONCAT44(extraout_var_03,iVar4);
        if (prevNum == 0) {
          return (RelocBlockWrapper *)0x0;
        }
        uVar1 = *(uint *)(prevNum + 4);
      }
      this->cachedRaw = (offset_t)ptr;
      this_local = (RelocBlockWrapper *)prevNum;
    }
    else {
      pEVar2 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar4 = (*(pEVar2->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar2,this->cachedRaw,1,8,0);
      this_local = (RelocBlockWrapper *)CONCAT44(extraout_var,iVar4);
    }
  }
  return this_local;
}

Assistant:

void* RelocBlockWrapper::getPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_BASE_RELOCATION* reloc = this->parentDir->reloc();
    if (!reloc) return NULL;

    offset_t raw = INVALID_ADDR;
    BYTE *ptr = NULL;

    // use my cached:
    if (this->cachedRaw != INVALID_ADDR) {
        ptr = m_Exe->getContentAt(this->cachedRaw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        return ptr;
    }

    // use previous cached to calculate my cached
    size_t prevNum = this->entryNum - 1;

    RelocBlockWrapper *prevEntry = dynamic_cast<RelocBlockWrapper*> (this->parentDir->getEntryAt(prevNum));
    if (prevEntry) {
        offset_t prevRaw = prevEntry->cachedRaw;

        IMAGE_BASE_RELOCATION* prevReloc = (IMAGE_BASE_RELOCATION*) prevEntry->getPtr();
        raw = prevRaw + prevReloc->SizeOfBlock;

        if (prevRaw != INVALID_ADDR) {
            ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));

            if (ptr != NULL) {
                this->cachedRaw = raw;
                return ptr;
            }
        }
    }
    // previous cached not avaliable, calculate...
    offset_t firstRaw = this->getOffset(reloc);
    offset_t blockSize = reloc->SizeOfBlock;

    raw = firstRaw;
    ptr = (BYTE*) reloc;

    for ( size_t i = 0; i < this->entryNum; i++) { //TODO: make caching
        raw += blockSize;

        ptr = m_Exe->getContentAt(raw, Executable::RAW, sizeof(IMAGE_BASE_RELOCATION));
        if (!ptr) return NULL;

        reloc = (IMAGE_BASE_RELOCATION*) ptr;
        blockSize = reloc->SizeOfBlock;
    }

    this->cachedRaw = raw;
    return ptr;
}